

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

string * skiwi::anon_unknown_1::get_cleaned_command(string *__return_storage_ptr__,string *txt)

{
  bool bVar1;
  string local_70 [8];
  string cleaned;
  size_type it;
  string local_38;
  string *local_18;
  string *txt_local;
  
  local_18 = txt;
  txt_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_38,(string *)txt);
  bVar1 = is_cmd_command(&local_38);
  if (!bVar1) {
    __assert_fail("is_cmd_command(txt)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/libskiwi.cpp"
                  ,0x25b,
                  "std::string skiwi::(anonymous namespace)::get_cleaned_command(std::string)");
  }
  std::__cxx11::string::~string((string *)&local_38);
  cleaned.field_2._8_8_ = std::__cxx11::string::find_first_not_of((char)txt,0x20);
  std::__cxx11::string::substr((ulong)local_70,(ulong)txt);
  cleaned.field_2._8_8_ = std::__cxx11::string::find_first_of((char)local_70,0x20);
  if (cleaned.field_2._8_8_ == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_70);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_70);
  }
  std::__cxx11::string::~string(local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string get_cleaned_command(std::string txt)
    {
    assert(is_cmd_command(txt));
    auto it = txt.find_first_not_of(' ');
    std::string cleaned = txt.substr(it);
    it = cleaned.find_first_of(' ');
    if (it == std::string::npos)
      return cleaned;
    return cleaned.substr(0, it);
    }